

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamCleaner.cpp
# Opt level: O3

void clipCoverage(string *filename,string *outfile)

{
  long lVar1;
  long lVar2;
  char cVar3;
  int iVar4;
  vector *pvVar5;
  long *plVar6;
  ostream *poVar7;
  runtime_error *prVar8;
  ulong uVar9;
  ulong uVar10;
  BamReader bamreader;
  BamWriter writer;
  string mateReferenceID;
  string referenceID;
  BamAlignment alignment;
  BamReader aBStack_1d8 [8];
  BamWriter local_1d0 [8];
  undefined1 *local_1c8;
  size_t local_1c0;
  undefined1 local_1b8 [16];
  undefined1 *local_1a8;
  size_t local_1a0;
  undefined1 local_198 [16];
  char *local_188;
  long local_180;
  char local_178 [152];
  int local_e0;
  int local_b8;
  
  BamTools::BamReader::BamReader(aBStack_1d8);
  cVar3 = BamTools::BamReader::Open((string *)aBStack_1d8);
  if (cVar3 != '\0') {
    BamTools::BamAlignment::BamAlignment((BamAlignment *)&local_188);
    BamTools::BamWriter::BamWriter(local_1d0);
    pvVar5 = (vector *)BamTools::BamReader::GetConstSamHeader();
    BamTools::BamReader::GetReferenceData();
    cVar3 = BamTools::BamWriter::Open((string *)local_1d0,(SamHeader *)outfile,pvVar5);
    if (cVar3 == '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"Couldn\'t open out Bamfile");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    while( true ) {
      cVar3 = BamTools::BamReader::GetNextAlignment((BamAlignment *)aBStack_1d8);
      if (cVar3 == '\0') {
        BamTools::BamWriter::Close();
        BamTools::BamWriter::~BamWriter(local_1d0);
        BamTools::BamAlignment::~BamAlignment((BamAlignment *)&local_188);
        BamTools::BamReader::~BamReader(aBStack_1d8);
        return;
      }
      plVar6 = (long *)BamTools::BamReader::GetReferenceData();
      uVar10 = (ulong)local_e0;
      lVar1 = *plVar6;
      uVar9 = (plVar6[1] - lVar1 >> 3) * -0x3333333333333333;
      if (uVar9 < uVar10 || uVar9 - uVar10 == 0) break;
      lVar2 = *(long *)(lVar1 + uVar10 * 0x28);
      local_1a8 = local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,lVar2,*(long *)(lVar1 + 8 + uVar10 * 0x28) + lVar2);
      plVar6 = (long *)BamTools::BamReader::GetReferenceData();
      uVar10 = (ulong)local_b8;
      lVar1 = *plVar6;
      uVar9 = (plVar6[1] - lVar1 >> 3) * -0x3333333333333333;
      if (uVar9 < uVar10 || uVar9 - uVar10 == 0) goto LAB_001025f3;
      lVar2 = *(long *)(lVar1 + uVar10 * 0x28);
      local_1c8 = local_1b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,lVar2,*(long *)(lVar1 + 8 + uVar10 * 0x28) + lVar2);
      cVar3 = BamTools::BamAlignment::IsProperPair();
      if (cVar3 != '\0') {
        cVar3 = BamTools::BamAlignment::IsDuplicate();
        if ((cVar3 == '\0') && (local_1a0 == local_1c0)) {
          if (local_1a0 != 0) {
            iVar4 = bcmp(local_1a8,local_1c8,local_1a0);
            if (iVar4 != 0) goto LAB_00102586;
          }
          cVar3 = BamTools::BamAlignment::IsFailedQC();
          if (cVar3 == '\0') {
            cVar3 = BamTools::BamAlignment::IsMapped();
            if (cVar3 != '\0') {
              cVar3 = BamTools::BamAlignment::IsMateMapped();
              if (cVar3 != '\0') {
                BamTools::BamWriter::SaveAlignment((BamAlignment *)local_1d0);
              }
            }
          }
        }
      }
LAB_00102586:
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      if (local_1a8 != local_198) {
        operator_delete(local_1a8);
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001025f3:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  BamTools::BamReader::GetFilename_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_188,local_180);
  std::endl<char,std::char_traits<char>>(poVar7);
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,"Couldn\'t open Bamfile");
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void clipCoverage(string filename, string outfile) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;

    BamTools::BamWriter writer;
    if (not writer.Open(outfile,bamreader.GetConstSamHeader(),bamreader.GetReferenceData())) {
            throw std::runtime_error("Couldn't open out Bamfile");
    }
    while (bamreader.GetNextAlignment(alignment)){
        string referenceID= bamreader.GetReferenceData().at(alignment.RefID).RefName;
        string mateReferenceID= bamreader.GetReferenceData().at(alignment.MateRefID).RefName;
        if (!alignment.IsProperPair() || alignment.IsDuplicate() || !(referenceID==mateReferenceID) || alignment.IsFailedQC() || !(alignment.IsMapped()&&alignment.IsMateMapped())) {
            continue;
        }
        writer.SaveAlignment(alignment);
    }
    writer.Close();
}